

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O0

void __thiscall Nova::Simplex_Mesh<3>::Initialize_Neighbor_Nodes(Simplex_Mesh<3> *this)

{
  size_t m;
  Array<Nova::Array<int>_> *pAVar1;
  INDEX *pIVar2;
  Vector<int,_3,_true> *this_00;
  int *piVar3;
  Array<int> *this_01;
  int local_58;
  int local_54;
  int j;
  int i;
  INDEX *element;
  size_t t;
  int local_2c;
  Array<int> local_28;
  Simplex_Mesh<3> *local_10;
  Simplex_Mesh<3> *this_local;
  
  local_10 = this;
  if ((this->neighbor_nodes != (Array<Nova::Array<int>_> *)0x0) &&
     (pAVar1 = this->neighbor_nodes, pAVar1 != (Array<Nova::Array<int>_> *)0x0)) {
    Array<Nova::Array<int>_>::~Array(pAVar1);
    operator_delete(pAVar1);
  }
  pAVar1 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  m = this->number_of_nodes;
  local_2c = 0;
  Array<int>::Array(&local_28,0,&local_2c);
  Array<Nova::Array<int>_>::Array(pAVar1,m,&local_28);
  this->neighbor_nodes = pAVar1;
  Array<int>::~Array(&local_28);
  for (element = (INDEX *)0x0;
      pIVar2 = (INDEX *)Array<Nova::Vector<int,_3,_true>_>::size(&this->elements), element < pIVar2;
      element = (INDEX *)((long)(element->_data)._M_elems + 1)) {
    this_00 = Array<Nova::Vector<int,_3,_true>_>::operator()(&this->elements,(int)element);
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        if (local_54 != local_58) {
          pAVar1 = this->neighbor_nodes;
          piVar3 = Vector<int,_3,_true>::operator[](this_00,local_54);
          this_01 = Array<Nova::Array<int>_>::operator()(pAVar1,*piVar3);
          piVar3 = Vector<int,_3,_true>::operator[](this_00,local_58);
          Array<int>::Append_Unique(this_01,piVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Neighbor_Nodes()
{
    if(neighbor_nodes!=nullptr) delete neighbor_nodes;
    neighbor_nodes=new Array<Array<int>>(number_of_nodes);
    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) for(int j=0;j<d;++j) if(i!=j) (*neighbor_nodes)(element[i]).Append_Unique(element[j]);}
}